

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O3

int __thiscall
soplex::
CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::setupColVals(CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *this)

{
  vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
  *this_00;
  uint *puVar1;
  undefined8 uVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  pointer pnVar6;
  iterator __position;
  int *piVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  bool bVar12;
  int iVar13;
  long lVar14;
  long lVar15;
  int iVar16;
  int *piVar17;
  int32_t *piVar18;
  uint uVar19;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  cpp_dec_float<50U,_int,_void> local_78;
  ulong local_40;
  cpp_dec_float<50U,_int,_void> *local_38;
  
  this_00 = &(this->u).col.val;
  pnVar6 = (this->u).col.val.
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pnVar6 != (this->u).col.val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
    (this->u).col.val.
    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = pnVar6;
  }
  iVar16 = this->thedim;
  std::
  vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
  ::reserve(this_00,(long)(this->u).col.size);
  __position._M_current =
       (this->u).col.val.
       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  iVar13 = (this->u).col.size;
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<long_long>
            (&local_78,0,(type *)0x0);
  std::
  vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
  ::_M_fill_insert(this_00,__position,(long)iVar13,(value_type *)&local_78);
  if (0 < this->thedim) {
    piVar17 = (this->u).col.len;
    lVar14 = 0;
    do {
      piVar17[lVar14] = 0;
      lVar14 = lVar14 + 1;
    } while (lVar14 < this->thedim);
  }
  local_78.fpclass = cpp_dec_float_finite;
  local_78.prec_elem = 10;
  local_78.data._M_elems[0] = 0;
  local_78.data._M_elems[1] = 0;
  local_78.data._M_elems[2] = 0;
  local_78.data._M_elems[3] = 0;
  local_78.data._M_elems[4] = 0;
  local_78.data._M_elems[5] = 0;
  local_78.data._M_elems._24_5_ = 0;
  local_78.data._M_elems[7]._1_3_ = 0;
  local_78.data._M_elems[8] = 0;
  local_78.data._M_elems[9] = 0;
  local_78.exp = 0;
  local_78.neg = false;
  boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
            ((cpp_dec_float<50u,int,void> *)&local_78,0.0);
  *(undefined8 *)(this->maxabs).m_backend.data._M_elems = local_78.data._M_elems._0_8_;
  *(undefined8 *)((this->maxabs).m_backend.data._M_elems + 2) = local_78.data._M_elems._8_8_;
  *(undefined8 *)((this->maxabs).m_backend.data._M_elems + 4) = local_78.data._M_elems._16_8_;
  *(ulong *)((this->maxabs).m_backend.data._M_elems + 6) =
       CONCAT35(local_78.data._M_elems[7]._1_3_,local_78.data._M_elems._24_5_);
  *(ulong *)((this->maxabs).m_backend.data._M_elems + 8) =
       CONCAT44(local_78.data._M_elems[9],local_78.data._M_elems[8]);
  (this->maxabs).m_backend.exp = local_78.exp;
  (this->maxabs).m_backend.neg = local_78.neg;
  (this->maxabs).m_backend.fpclass = local_78.fpclass;
  (this->maxabs).m_backend.prec_elem = local_78.prec_elem;
  iVar13 = this->thedim;
  if (0 < iVar13) {
    local_38 = &(this->maxabs).m_backend;
    lVar14 = 0;
    do {
      uVar19 = (this->u).row.len[lVar14];
      local_40 = (ulong)uVar19;
      if (0 < (int)uVar19) {
        iVar13 = (this->u).row.start[lVar14];
        piVar17 = (this->u).row.idx + iVar13;
        uVar19 = uVar19 + 1;
        piVar18 = &(this->u).row.val.
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[iVar13].m_backend.prec_elem;
        do {
          iVar13 = *piVar17;
          piVar7 = (this->u).col.len;
          iVar3 = piVar7[iVar13];
          lVar15 = (long)(this->u).col.start[iVar13] + (long)iVar3;
          piVar7[iVar13] = iVar3 + 1;
          (this->u).col.idx[lVar15] = (int)lVar14;
          pnVar6 = (this->u).col.val.
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          *(undefined8 *)((long)pnVar6[lVar15].m_backend.data._M_elems + 0x20) =
               *(undefined8 *)(piVar18 + -5);
          uVar2 = *(undefined8 *)
                   (((cpp_dec_float<50U,_int,_void> *)(piVar18 + -0xd))->data)._M_elems;
          uVar8 = *(undefined8 *)(piVar18 + -0xb);
          uVar9 = *(undefined8 *)(piVar18 + -7);
          puVar1 = (uint *)((long)pnVar6[lVar15].m_backend.data._M_elems + 0x10);
          *(undefined8 *)puVar1 = *(undefined8 *)(piVar18 + -9);
          *(undefined8 *)(puVar1 + 2) = uVar9;
          *(undefined8 *)pnVar6[lVar15].m_backend.data._M_elems = uVar2;
          *(undefined8 *)((long)pnVar6[lVar15].m_backend.data._M_elems + 8) = uVar8;
          local_78.exp = piVar18[-3];
          pnVar6[lVar15].m_backend.exp = local_78.exp;
          local_78.neg = *(bool *)(piVar18 + -2);
          pnVar6[lVar15].m_backend.neg = local_78.neg;
          local_78.fpclass = piVar18[-1];
          pnVar6[lVar15].m_backend.fpclass = local_78.fpclass;
          local_78.prec_elem = *piVar18;
          pnVar6[lVar15].m_backend.prec_elem = local_78.prec_elem;
          local_78.data._M_elems._0_8_ =
               *(undefined8 *)(((cpp_dec_float<50U,_int,_void> *)(piVar18 + -0xd))->data)._M_elems;
          local_78.data._M_elems._8_8_ = *(undefined8 *)(piVar18 + -0xb);
          local_78.data._M_elems._16_8_ = *(undefined8 *)(piVar18 + -9);
          local_78.data._M_elems[8] = (uint)*(undefined8 *)(piVar18 + -5);
          local_78.data._M_elems[9] = (uint)((ulong)*(undefined8 *)(piVar18 + -5) >> 0x20);
          local_78.data._M_elems._24_5_ = SUB85(*(undefined8 *)(piVar18 + -7),0);
          local_78.data._M_elems[7]._1_3_ =
               (undefined3)((ulong)*(undefined8 *)(piVar18 + -7) >> 0x28);
          if ((local_78.neg == true) &&
             (local_78.data._M_elems[0] != 0 || local_78.fpclass != cpp_dec_float_finite)) {
            local_78.neg = false;
          }
          if ((local_78.fpclass != cpp_dec_float_NaN) &&
             ((this->maxabs).m_backend.fpclass != cpp_dec_float_NaN)) {
            iVar13 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                               (&local_78,local_38);
            if (0 < iVar13) {
              uVar4 = (((cpp_dec_float<50U,_int,_void> *)(piVar18 + -0xd))->data)._M_elems[0];
              uVar5 = piVar18[-4];
              uVar8 = *(undefined8 *)(piVar18 + -8);
              uVar9 = *(undefined8 *)(piVar18 + -6);
              uVar10 = *(undefined8 *)(piVar18 + -0xc);
              uVar11 = *(undefined8 *)(piVar18 + -10);
              bVar12 = *(bool *)(piVar18 + -2);
              uVar2 = *(undefined8 *)(piVar18 + -1);
              if (bVar12 == true) {
                bVar12 = (int)uVar2 == 0 && uVar4 == 0;
              }
              iVar13 = piVar18[-3];
              (this->maxabs).m_backend.data._M_elems[0] = uVar4;
              (this->maxabs).m_backend.data._M_elems[9] = uVar5;
              *(undefined8 *)((this->maxabs).m_backend.data._M_elems + 5) = uVar8;
              *(undefined8 *)((this->maxabs).m_backend.data._M_elems + 7) = uVar9;
              *(undefined8 *)((this->maxabs).m_backend.data._M_elems + 1) = uVar10;
              *(undefined8 *)((this->maxabs).m_backend.data._M_elems + 3) = uVar11;
              (this->maxabs).m_backend.exp = iVar13;
              (this->maxabs).m_backend.neg = bVar12;
              (this->maxabs).m_backend.fpclass = (int)uVar2;
              (this->maxabs).m_backend.prec_elem = (int)((ulong)uVar2 >> 0x20);
            }
          }
          piVar17 = piVar17 + 1;
          uVar19 = uVar19 - 1;
          piVar18 = piVar18 + 0xe;
        } while (1 < uVar19);
        iVar13 = this->thedim;
        uVar19 = (uint)local_40;
      }
      iVar16 = iVar16 + uVar19;
      lVar14 = lVar14 + 1;
    } while (lVar14 < iVar13);
  }
  return iVar16;
}

Assistant:

int CLUFactor<R>::setupColVals()
{
   int i;
   int n = thedim;

   if(!u.col.val.empty())
      u.col.val.clear();

   u.col.val.reserve(u.col.size); // small performance improvement before the insertion
   u.col.val.insert(u.col.val.begin(), u.col.size, 0);

   for(i = 0; i < thedim; i++)
      u.col.len[i] = 0;

   maxabs = R(0.0);

   for(i = 0; i < thedim; i++)
   {
      int     k   = u.row.start[i];
      int*    idx = &u.row.idx[k];
      R*   val = &u.row.val[k];
      int     len = u.row.len[i];

      n += len;

      while(len-- > 0)
      {
         assert((*idx >= 0) && (*idx < thedim));

         k = u.col.start[*idx] + u.col.len[*idx];

         assert((k >= 0) && (k < u.col.size));

         u.col.len[*idx]++;

         assert(u.col.len[*idx] <= u.col.max[*idx]);

         u.col.idx[k] = i;
         u.col.val[k] = *val;

         if(spxAbs(*val) > maxabs)
            maxabs = spxAbs(*val);

         idx++;

         val++;
      }
   }

   return n;
}